

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O0

IterateResult __thiscall gl3cts::TextureSizePromotion::FunctionalTest::iterate(FunctionalTest *this)

{
  TextureInternalFormatDescriptor *pTVar1;
  bool bVar2;
  byte bVar3;
  GLuint GVar4;
  RenderContext *pRVar5;
  ContextInfo *this_00;
  TestContext *pTVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  long lVar9;
  MessageBuilder local_718;
  MessageBuilder local_598;
  MessageBuilder local_418;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  ColorChannelSelector local_1cc;
  undefined8 uStack_1c8;
  GLuint k;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  deUint32 local_44;
  ApiType local_40;
  uint local_3c;
  deUint32 local_38;
  GLuint j;
  uint local_30;
  GLuint i;
  deUint32 local_20;
  ApiType local_1c;
  byte local_17;
  byte local_16;
  byte local_15;
  deUint32 local_14;
  bool was_error;
  bool is_ok;
  bool is_arb_texture_storage_multisample;
  FunctionalTest *pFStack_10;
  ContextType context_type;
  FunctionalTest *this_local;
  
  pFStack_10 = this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  local_14 = (*pRVar5->_vptr_RenderContext[2])();
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_15 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_texture_storage_multisample");
  local_16 = 1;
  local_17 = 0;
  local_1c.m_bits = local_14;
  local_20 = (deUint32)glu::ApiType::core(3,1);
  bVar2 = glu::contextSupports((ContextType)local_1c.m_bits,(ApiType)local_20);
  if (bVar2) {
    prepareVertexArrayObject(this);
    for (local_30 = 0; local_30 < 0x44; local_30 = local_30 + 1) {
      j = local_14;
      local_38 = (deUint32)
                 glu::ContextType::getAPI((ContextType *)(s_formats + (ulong)local_30 * 0x40));
      bVar2 = glu::contextSupports((ContextType)j,(ApiType)local_38);
      if (bVar2) {
        for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
          bVar2 = isTargetMultisampled
                            (this,*(GLenum *)(s_source_texture_targets + (ulong)local_3c * 4));
          if (bVar2) {
            if ((local_15 & 1) == 0) {
              local_40.m_bits = local_14;
              local_44 = (deUint32)glu::ApiType::core(4,3);
              bVar2 = glu::contextSupports((ContextType)local_40.m_bits,(ApiType)local_44);
              if (bVar2) goto LAB_00e0fcd7;
            }
            else {
LAB_00e0fcd7:
              if ((s_formats[(ulong)local_30 * 0x40 + 0x11] & 1) != 0) {
                lVar9 = (ulong)local_30 * 0x40;
                pTVar1 = (TextureInternalFormatDescriptor *)(s_formats + lVar9);
                local_88._0_4_ = pTVar1->required_by_context;
                local_88._4_4_ = pTVar1->internal_format;
                uStack_80 = *(undefined8 *)(s_formats + lVar9 + 8);
                local_78 = *(undefined8 *)(s_formats + lVar9 + 0x10);
                uStack_70 = *(undefined8 *)(s_formats + lVar9 + 0x18);
                local_68 = *(undefined8 *)(s_formats + lVar9 + 0x20);
                uStack_60 = *(undefined8 *)(s_formats + lVar9 + 0x28);
                local_58 = *(undefined8 *)(s_formats + lVar9 + 0x30);
                uStack_50 = *(undefined8 *)(s_formats + lVar9 + 0x38);
                bVar2 = isDepthType(this,*pTVar1);
                if (!bVar2) {
                  lVar9 = (ulong)local_30 * 0x40;
                  pTVar1 = (TextureInternalFormatDescriptor *)(s_formats + lVar9);
                  local_c8._0_4_ = pTVar1->required_by_context;
                  local_c8._4_4_ = pTVar1->internal_format;
                  uStack_c0 = *(undefined8 *)(s_formats + lVar9 + 8);
                  local_b8 = *(undefined8 *)(s_formats + lVar9 + 0x10);
                  uStack_b0 = *(undefined8 *)(s_formats + lVar9 + 0x18);
                  local_a8 = *(undefined8 *)(s_formats + lVar9 + 0x20);
                  uStack_a0 = *(undefined8 *)(s_formats + lVar9 + 0x28);
                  local_98 = *(undefined8 *)(s_formats + lVar9 + 0x30);
                  uStack_90 = *(undefined8 *)(s_formats + lVar9 + 0x38);
                  bVar2 = isStencilType(this,*pTVar1);
                  if (!bVar2) goto LAB_00e0fdfe;
                }
              }
            }
          }
          else {
LAB_00e0fdfe:
            lVar9 = (ulong)local_30 * 0x40;
            pTVar1 = (TextureInternalFormatDescriptor *)(s_formats + lVar9);
            local_108._0_4_ = pTVar1->required_by_context;
            local_108._4_4_ = pTVar1->internal_format;
            uStack_100 = *(undefined8 *)(s_formats + lVar9 + 8);
            local_f8 = *(undefined8 *)(s_formats + lVar9 + 0x10);
            uStack_f0 = *(undefined8 *)(s_formats + lVar9 + 0x18);
            local_e8 = *(undefined8 *)(s_formats + lVar9 + 0x20);
            uStack_e0 = *(undefined8 *)(s_formats + lVar9 + 0x28);
            local_d8 = *(undefined8 *)(s_formats + lVar9 + 0x30);
            uStack_d0 = *(undefined8 *)(s_formats + lVar9 + 0x38);
            bVar2 = isDepthType(this,*pTVar1);
            if (bVar2) {
LAB_00e0ff18:
              if (*(int *)(s_source_texture_targets + (ulong)local_3c * 4) == 0x806f)
              goto LAB_00e102e7;
            }
            else {
              lVar9 = (ulong)local_30 * 0x40;
              pTVar1 = (TextureInternalFormatDescriptor *)(s_formats + lVar9);
              local_148._0_4_ = pTVar1->required_by_context;
              local_148._4_4_ = pTVar1->internal_format;
              uStack_140 = *(undefined8 *)(s_formats + lVar9 + 8);
              local_138 = *(undefined8 *)(s_formats + lVar9 + 0x10);
              uStack_130 = *(undefined8 *)(s_formats + lVar9 + 0x18);
              local_128 = *(undefined8 *)(s_formats + lVar9 + 0x20);
              uStack_120 = *(undefined8 *)(s_formats + lVar9 + 0x28);
              local_118 = *(undefined8 *)(s_formats + lVar9 + 0x30);
              uStack_110 = *(undefined8 *)(s_formats + lVar9 + 0x38);
              bVar2 = isStencilType(this,*pTVar1);
              if (bVar2) goto LAB_00e0ff18;
            }
            lVar9 = (ulong)local_30 * 0x40;
            pTVar1 = (TextureInternalFormatDescriptor *)(s_formats + lVar9);
            local_188._0_4_ = pTVar1->required_by_context;
            local_188._4_4_ = pTVar1->internal_format;
            uStack_180 = *(undefined8 *)(s_formats + lVar9 + 8);
            local_178 = *(undefined8 *)(s_formats + lVar9 + 0x10);
            uStack_170 = *(undefined8 *)(s_formats + lVar9 + 0x18);
            local_168 = *(undefined8 *)(s_formats + lVar9 + 0x20);
            uStack_160 = *(undefined8 *)(s_formats + lVar9 + 0x28);
            local_158 = *(undefined8 *)(s_formats + lVar9 + 0x30);
            uStack_150 = *(undefined8 *)(s_formats + lVar9 + 0x38);
            prepareSourceTexture
                      (this,*pTVar1,*(GLenum *)(s_source_texture_targets + (ulong)local_3c * 4));
            bVar3 = local_16 & 1;
            lVar9 = (ulong)local_30 * 0x40;
            pTVar1 = (TextureInternalFormatDescriptor *)(s_formats + lVar9);
            uStack_1c8._0_4_ = pTVar1->required_by_context;
            uStack_1c8._4_4_ = pTVar1->internal_format;
            uStack_1c0 = *(undefined8 *)(s_formats + lVar9 + 8);
            local_1b8 = *(undefined8 *)(s_formats + lVar9 + 0x10);
            uStack_1b0 = *(undefined8 *)(s_formats + lVar9 + 0x18);
            local_1a8 = *(undefined8 *)(s_formats + lVar9 + 0x20);
            uStack_1a0 = *(undefined8 *)(s_formats + lVar9 + 0x28);
            local_198 = *(undefined8 *)(s_formats + lVar9 + 0x30);
            uStack_190 = *(undefined8 *)(s_formats + lVar9 + 0x38);
            bVar2 = checkSourceTextureSizeAndType
                              (this,*pTVar1,
                               *(GLenum *)(s_source_texture_targets + (ulong)local_3c * 4));
            local_16 = (bVar3 & bVar2) != 0;
            for (local_1cc = RED_COMPONENT; local_1cc < COMPONENTS_COUNT;
                local_1cc = local_1cc + GREEN_COMPONENT) {
              lVar9 = (ulong)local_30 * 0x40;
              pTVar1 = (TextureInternalFormatDescriptor *)(s_formats + lVar9);
              local_218._0_4_ = pTVar1->required_by_context;
              local_218._4_4_ = pTVar1->internal_format;
              uStack_210 = *(undefined8 *)(s_formats + lVar9 + 8);
              local_208 = *(undefined8 *)(s_formats + lVar9 + 0x10);
              uStack_200 = *(undefined8 *)(s_formats + lVar9 + 0x18);
              local_1f8 = *(undefined8 *)(s_formats + lVar9 + 0x20);
              uStack_1f0 = *(undefined8 *)(s_formats + lVar9 + 0x28);
              local_1e8 = *(undefined8 *)(s_formats + lVar9 + 0x30);
              uStack_1e0 = *(undefined8 *)(s_formats + lVar9 + 0x38);
              prepareDestinationTextureAndFramebuffer(this,*pTVar1,0xde1);
              lVar9 = (ulong)local_30 * 0x40;
              pTVar1 = (TextureInternalFormatDescriptor *)(s_formats + lVar9);
              local_258._0_4_ = pTVar1->required_by_context;
              local_258._4_4_ = pTVar1->internal_format;
              uStack_250 = *(undefined8 *)(s_formats + lVar9 + 8);
              local_248 = *(undefined8 *)(s_formats + lVar9 + 0x10);
              uStack_240 = *(undefined8 *)(s_formats + lVar9 + 0x18);
              local_238 = *(undefined8 *)(s_formats + lVar9 + 0x20);
              uStack_230 = *(undefined8 *)(s_formats + lVar9 + 0x28);
              local_228 = *(undefined8 *)(s_formats + lVar9 + 0x30);
              uStack_220 = *(undefined8 *)(s_formats + lVar9 + 0x38);
              GVar4 = prepareProgram(this,*(GLenum *)
                                           (s_source_texture_targets + (ulong)local_3c * 4),*pTVar1,
                                     local_1cc);
              this->m_program = GVar4;
              makeProgramAndSourceTextureActive
                        (this,*(GLenum *)(s_source_texture_targets + (ulong)local_3c * 4));
              drawQuad(this);
              bVar3 = local_16 & 1;
              lVar9 = (ulong)local_30 * 0x40;
              pTVar1 = (TextureInternalFormatDescriptor *)(s_formats + lVar9);
              local_298._0_4_ = pTVar1->required_by_context;
              local_298._4_4_ = pTVar1->internal_format;
              uStack_290 = *(undefined8 *)(s_formats + lVar9 + 8);
              local_288 = *(undefined8 *)(s_formats + lVar9 + 0x10);
              uStack_280 = *(undefined8 *)(s_formats + lVar9 + 0x18);
              local_278 = *(undefined8 *)(s_formats + lVar9 + 0x20);
              uStack_270 = *(undefined8 *)(s_formats + lVar9 + 0x28);
              local_268 = *(undefined8 *)(s_formats + lVar9 + 0x30);
              uStack_260 = *(undefined8 *)(s_formats + lVar9 + 0x38);
              bVar2 = checkDestinationTexture
                                (this,*pTVar1,local_1cc,
                                 *(GLenum *)(s_source_texture_targets + (ulong)local_3c * 4),
                                 *(GLchar **)(s_source_texture_targets_names + (ulong)local_3c * 8))
              ;
              local_16 = bVar2 & bVar3;
              cleanDestinationTexture(this);
              cleanFramebuffer(this);
              cleanProgram(this);
            }
            cleanSourceTexture(this);
          }
LAB_00e102e7:
        }
      }
    }
  }
  cleanSourceTexture(this);
  cleanDestinationTexture(this);
  cleanFramebuffer(this);
  cleanProgram(this);
  cleanVertexArrayObject(this);
  if ((local_16 & 1) == 0) {
    if ((local_17 & 1) == 0) {
      pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar7 = tcu::TestContext::getLog(pTVar6);
      tcu::TestLog::operator<<(&local_718,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_718,(char (*) [41])"Texture Size Promotion Test have failed.");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_718);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar7 = tcu::TestContext::getLog(pTVar6);
      tcu::TestLog::operator<<(&local_598,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_598,
                          (char (*) [51])"Texture Size Promotion Test have approached error.");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_598);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_INTERNAL_ERROR,"Error");
    }
  }
  else {
    pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar7 = tcu::TestContext::getLog(pTVar6);
    tcu::TestLog::operator<<(&local_418,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_418,(char (*) [41])"Texture Size Promotion Test have passed.");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_418);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest::iterate()
{
	/* Get context setup. */
	glu::ContextType context_type = m_context.getRenderContext().getType();
	bool			 is_arb_texture_storage_multisample =
		m_context.getContextInfo().isExtensionSupported("GL_ARB_texture_storage_multisample");

	/* Prepare initial results. */
	bool is_ok	 = true;
	bool was_error = false;

	/* Iterate over test cases. */
	try
	{
		/* Only for OpenGL 3.1 context. */
		if (glu::contextSupports(context_type, glu::ApiType::core(3, 1)))
		{
			/* Generate and bind VAO. */
			prepareVertexArrayObject();

			/* For every required format */
			for (glw::GLuint i = 0; i < s_formats_size; ++i)
			{
				/* Test only if format is required by context. */
				if (glu::contextSupports(context_type, s_formats[i].required_by_context.getAPI()))
				{
					/* For every target. */
					for (glw::GLuint j = 0; j < s_source_texture_targets_count; ++j)
					{
						/* Test if it is supported by context or internal format. */
						if (isTargetMultisampled(s_source_texture_targets[j]))
						{
							if ((!is_arb_texture_storage_multisample) &&
								(!glu::contextSupports(context_type, glu::ApiType::core(4, 3))))
							{
								continue;
							}

							if (!s_formats[i]
									 .is_color_renderable) /* Multisampled textures need to be set using rendering. */
							{
								continue;
							}

							if (isDepthType(s_formats[i]) || isStencilType(s_formats[i]))
							{
								continue;
							}
						}

						if ((isDepthType(s_formats[i]) || isStencilType(s_formats[i])) &&
							(GL_TEXTURE_3D == s_source_texture_targets[j]))
						{
							continue;
						}

						/* Prepare source texture to be tested. */
						prepareSourceTexture(s_formats[i], s_source_texture_targets[j]);

						/* Check basic API queries for source texture. */
						is_ok = is_ok & checkSourceTextureSizeAndType(s_formats[i], s_source_texture_targets[j]);

						/* For every [R, G, B, A] component. */
						for (glw::GLuint k = 0; k < COMPONENTS_COUNT; ++k)
						{
							/* Prepare destination texture. */
							prepareDestinationTextureAndFramebuffer(s_formats[i], GL_TEXTURE_2D);

							/* Building program (throws on failure). */
							m_program =
								prepareProgram(s_source_texture_targets[j], s_formats[i], ColorChannelSelector(k));

							/* Setup GL and draw. */
							makeProgramAndSourceTextureActive(s_source_texture_targets[j]);

							drawQuad();

							/* Check results. */
							is_ok = is_ok & checkDestinationTexture(s_formats[i], ColorChannelSelector(k),
																	s_source_texture_targets[j],
																	s_source_texture_targets_names[j]);

							/* Cleanup. */
							cleanDestinationTexture();
							cleanFramebuffer();
							cleanProgram();
						}

						cleanSourceTexture();
					}
				}
			}
		}
	}
	catch (...)
	{
		/* Error have occured. */
		is_ok	 = false;
		was_error = true;
	}

	/* Clean all. */

	cleanSourceTexture();
	cleanDestinationTexture();
	cleanFramebuffer();
	cleanProgram();
	cleanVertexArrayObject();

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Texture Size Promotion Test have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (was_error)
		{
			/* Log error. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Texture Size Promotion Test have approached error."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			/* Log fail. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Texture Size Promotion Test have failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	/* End test. */
	return tcu::TestNode::STOP;
}